

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  undefined8 *puVar1;
  stbi__uint32 b;
  stbi__context *s;
  uint uVar2;
  stbi__uint32 sVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  stbi_uc *psVar7;
  byte *pbVar8;
  void *pvVar9;
  byte bVar10;
  ulong uVar11;
  byte *pbVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  stbi_uc **ppsVar13;
  uint uVar14;
  int iVar15;
  int *piVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  int local_64;
  
  s = z->s;
  uVar2 = stbi__get16be(s);
  if (uVar2 < 0xb) goto LAB_00166a40;
  psVar7 = s->img_buffer;
  if (psVar7 < s->img_buffer_end) {
LAB_00166a72:
    s->img_buffer = psVar7 + 1;
    if (*psVar7 == '\b') {
      sVar3 = stbi__get16be(s);
      s->img_y = sVar3;
      if (sVar3 == 0) {
        pcVar6 = "JPEG format not supported: delayed height";
        goto LAB_00166ac4;
      }
      sVar3 = stbi__get16be(s);
      s->img_x = sVar3;
      if (sVar3 != 0) {
        if (0x1000000 < s->img_y) {
          pcVar6 = "Very large image (corrupt?)";
          goto LAB_00166ac4;
        }
        pbVar12 = s->img_buffer;
        if (s->img_buffer_end <= pbVar12) {
          if (s->read_from_callbacks == 0) goto LAB_00166a40;
          stbi__refill_buffer(s);
          pbVar12 = s->img_buffer;
        }
        pbVar8 = pbVar12 + 1;
        s->img_buffer = pbVar8;
        bVar10 = *pbVar12;
        uVar21 = (ulong)bVar10;
        if ((bVar10 < 5) && ((0x1aU >> (bVar10 & 0x1f) & 1) != 0)) {
          s->img_n = (uint)bVar10;
          uVar11 = (ulong)(uint)bVar10;
          ppsVar13 = &z->img_comp[0].data;
          do {
            *ppsVar13 = (stbi_uc *)0x0;
            ppsVar13[3] = (stbi_uc *)0x0;
            ppsVar13 = ppsVar13 + 0xc;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
          if (uVar2 == (uint)bVar10 + (uint)bVar10 * 2 + 8) {
            z->rgb = 0;
            piVar16 = &z->img_comp[0].tq;
            lVar18 = 0;
            do {
              iVar20 = (int)uVar21;
              if (pbVar8 < s->img_buffer_end) {
LAB_00166b9f:
                s->img_buffer = pbVar8 + 1;
                bVar10 = *pbVar8;
                pbVar8 = pbVar8 + 1;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  pbVar8 = s->img_buffer;
                  iVar20 = s->img_n;
                  goto LAB_00166b9f;
                }
                bVar10 = 0;
              }
              ((anon_struct_96_18_0d0905d3 *)(piVar16 + -3))->id = (uint)bVar10;
              if ((iVar20 == 3) && (bVar10 == "RGB"[lVar18])) {
                z->rgb = z->rgb + 1;
              }
              if (s->img_buffer_end <= pbVar8) {
                if (s->read_from_callbacks == 0) {
                  piVar16[-2] = 0;
                  goto LAB_00166a40;
                }
                stbi__refill_buffer(s);
                pbVar8 = s->img_buffer;
              }
              pbVar12 = pbVar8 + 1;
              s->img_buffer = pbVar12;
              bVar10 = *pbVar8;
              piVar16[-2] = (uint)(bVar10 >> 4);
              if (((byte)(bVar10 + 0xb0) < 0xc0) ||
                 (piVar16[-1] = bVar10 & 0xf, (bVar10 & 0xf) - 5 < 0xfffffffc)) goto LAB_00166a40;
              if (pbVar12 < s->img_buffer_end) {
LAB_00166c4b:
                s->img_buffer = pbVar12 + 1;
                bVar10 = *pbVar12;
                *piVar16 = (uint)bVar10;
                pbVar8 = pbVar12 + 1;
                if (3 < bVar10) goto LAB_00166a40;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  pbVar12 = s->img_buffer;
                  goto LAB_00166c4b;
                }
                *piVar16 = 0;
                pbVar8 = pbVar12;
              }
              lVar18 = lVar18 + 1;
              iVar20 = s->img_n;
              uVar21 = (ulong)iVar20;
              piVar16 = piVar16 + 0x18;
            } while (lVar18 < (long)uVar21);
            if (scan != 0) {
              return 1;
            }
            sVar3 = s->img_x;
            b = s->img_y;
            iVar4 = stbi__mad3sizes_valid(sVar3,b,iVar20,0);
            if (iVar4 == 0) {
              *(char **)(in_FS_OFFSET + -0x20) = "Image too large to decode";
              return 0;
            }
            uVar17 = 1;
            uVar2 = 1;
            if (0 < iVar20) {
              uVar17 = 1;
              lVar18 = 0;
              uVar2 = 1;
              do {
                uVar5 = *(uint *)((long)&z->img_comp[0].h + lVar18);
                uVar14 = *(uint *)((long)&z->img_comp[0].v + lVar18);
                if ((int)uVar2 < (int)uVar5) {
                  uVar2 = uVar5;
                }
                if ((int)uVar17 < (int)uVar14) {
                  uVar17 = uVar14;
                }
                lVar18 = lVar18 + 0x60;
              } while (uVar21 * 0x60 != lVar18);
              if (0 < iVar20) {
                lVar18 = 0;
                do {
                  if (((int)uVar2 % *(int *)((long)&z->img_comp[0].h + lVar18) != 0) ||
                     ((int)uVar17 % *(int *)((long)&z->img_comp[0].v + lVar18) != 0))
                  goto LAB_00166a40;
                  lVar18 = lVar18 + 0x60;
                } while (uVar21 * 0x60 != lVar18);
              }
            }
            uVar14 = ((sVar3 + uVar2 * 8) - 1) / (uVar2 * 8);
            uVar5 = ((b + uVar17 * 8) - 1) / (uVar17 * 8);
            z->img_h_max = uVar2;
            z->img_v_max = uVar17;
            z->img_mcu_w = uVar2 * 8;
            z->img_mcu_h = uVar17 * 8;
            z->img_mcu_x = uVar14;
            z->img_mcu_y = uVar5;
            if (iVar20 < 1) {
              return 1;
            }
            local_64 = 1;
            lVar18 = 0;
            while( true ) {
              iVar15 = *(int *)((long)&z->img_comp[0].h + lVar18);
              iVar19 = *(int *)((long)&z->img_comp[0].v + lVar18);
              *(uint *)((long)&z->img_comp[0].x + lVar18) = (iVar15 * sVar3 + (uVar2 - 1)) / uVar2;
              *(uint *)((long)&z->img_comp[0].y + lVar18) = (iVar19 * b + (uVar17 - 1)) / uVar17;
              iVar15 = iVar15 * uVar14;
              iVar20 = iVar15 * 8;
              *(int *)((long)&z->img_comp[0].w2 + lVar18) = iVar20;
              iVar19 = iVar19 * uVar5;
              iVar4 = iVar19 * 8;
              *(int *)((long)&z->img_comp[0].h2 + lVar18) = iVar4;
              pvVar9 = stbi__malloc_mad2(iVar20,iVar4,0xf);
              puVar1 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar18);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined8 *)((long)&z->img_comp[0].coeff + lVar18) = 0;
              *(void **)((long)&z->img_comp[0].raw_data + lVar18) = pvVar9;
              why = extraout_EDX;
              if (pvVar9 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].data + lVar18) =
                   (long)pvVar9 + 0xfU & 0xfffffffffffffff0;
              if (z->progressive != 0) {
                *(int *)((long)&z->img_comp[0].coeff_w + lVar18) = iVar15;
                *(int *)((long)&z->img_comp[0].coeff_h + lVar18) = iVar19;
                pvVar9 = stbi__malloc_mad3(iVar20,iVar4,2,0xf);
                *(void **)((long)&z->img_comp[0].raw_coeff + lVar18) = pvVar9;
                why = extraout_EDX_00;
                if (pvVar9 == (void *)0x0) break;
                *(ulong *)((long)&z->img_comp[0].coeff + lVar18) =
                     (long)pvVar9 + 0xfU & 0xfffffffffffffff0;
              }
              local_64 = local_64 + 1;
              lVar18 = lVar18 + 0x60;
              if (uVar21 * 0x60 == lVar18) {
                return 1;
              }
            }
            *(char **)(in_FS_OFFSET + -0x20) = "Out of memory";
            stbi__free_jpeg_components(z,local_64,why);
            return 0;
          }
        }
      }
LAB_00166a40:
      pcVar6 = "Corrupt JPEG";
      goto LAB_00166ac4;
    }
  }
  else if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    psVar7 = s->img_buffer;
    goto LAB_00166a72;
  }
  pcVar6 = "JPEG format not supported: 8-bit only";
LAB_00166ac4:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar6;
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // check that plane subsampling factors are integer ratios; our resamplers can't deal with fractional ratios
   // and I've never seen a non-corrupted JPEG file actually use them
   for (i=0; i < s->img_n; ++i) {
      if (h_max % z->img_comp[i].h != 0) return stbi__err("bad H","Corrupt JPEG");
      if (v_max % z->img_comp[i].v != 0) return stbi__err("bad V","Corrupt JPEG");
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}